

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O3

bool __thiscall
HighsTransformedLp::transform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<double,_std::allocator<double>_> *upper,
          vector<double,_std::allocator<double>_> *solval,vector<int,_std::allocator<int>_> *inds,
          double *rhs,bool *integersPositive,bool preferVbds)

{
  vector<int,_std::allocator<int>_> *this_00;
  double *pdVar1;
  HighsMipSolver *pHVar2;
  _Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_> _Var3;
  pointer ppVar4;
  pointer pHVar5;
  HighsOptions *pHVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  pointer pBVar11;
  pointer pdVar12;
  pointer piVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  pointer piVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  HighsSparseVectorSum *this_01;
  HighsInt HVar19;
  int iVar20;
  ulong uVar21;
  double dVar22;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  bool infeasible_1;
  bool redundant_1;
  bool infeasible;
  bool redundant;
  double local_c0;
  double local_b0;
  bool local_a8;
  bool local_a7;
  bool local_a6;
  bool local_a5;
  HighsInt local_a4;
  vector<int,_std::allocator<int>_> *local_a0;
  ulong local_98;
  vector<double,_std::allocator<double>_> *local_90;
  double local_88;
  undefined8 uStack_80;
  vector<double,_std::allocator<double>_> *local_70;
  HighsSparseVectorSum *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  double *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_c0 = *rhs;
  pHVar2 = this->lprelaxation->mipsolver;
  HVar19 = (this->lprelaxation->lpsolver).model_.lp_.num_col_;
  uVar18 = (ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_a0 = inds;
  local_60 = solval;
  local_58 = upper;
  local_50 = rhs;
  if ((int)uVar18 < 1) {
    local_b0 = 0.0;
  }
  else {
    local_68 = &this->vectorsum;
    iVar20 = 0;
    local_b0 = 0.0;
    dVar22 = local_c0;
    local_a4 = HVar19;
    do {
      iVar17 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar20];
      lVar16 = (long)iVar17;
      local_98 = uVar18;
      if (iVar17 < HVar19) {
        _Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
             (pHVar2->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>;
        dVar26 = *(double *)
                  (*(long *)((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                   _M_head_impl + 0x6b0) + lVar16 * 8);
        uVar27 = 0;
        dVar25 = *(double *)
                  (*(long *)((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                   _M_head_impl + 0x698) + lVar16 * 8);
        uVar28 = 0;
      }
      else {
        local_88 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar17 - HVar19);
        uStack_80 = extraout_XMM0_Qb;
        dVar26 = HighsLpRelaxation::slackUpper(this->lprelaxation,iVar17 - HVar19);
        uVar27 = extraout_XMM0_Qb_00;
        dVar25 = local_88;
        uVar28 = uStack_80;
      }
      dVar23 = dVar26 - dVar25;
      if ((pHVar2->options_mip_->super_HighsOptionsStruct).small_matrix_value <= dVar23) {
        if ((dVar25 <= -INFINITY) && (this_01 = local_68, INFINITY <= dVar26)) goto LAB_002f020a;
        ppVar4 = (this->bestVub).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_90 = (vector<double,_std::allocator<double>_> *)dVar23;
        local_88 = dVar25;
        uStack_80 = uVar28;
        local_48 = dVar26;
        uStack_40 = uVar27;
        if (ppVar4[lVar16].first != -1) {
          dVar25 = ppVar4[lVar16].second.constant;
          dVar23 = ppVar4[lVar16].second.coef;
          dVar24 = 0.0;
          if (0.0 <= dVar23) {
            dVar24 = dVar23;
          }
          dVar23 = dVar25 + dVar24;
          _Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          if (*(double *)
               ((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl + 0x6620
               ) + dVar26 <
              (dVar24 - (dVar23 - dVar25)) + (dVar25 - (dVar23 - (dVar23 - dVar25))) + 0.0 + dVar23)
          {
            local_a5 = false;
            local_a6 = false;
            HighsImplications::cleanupVub
                      ((HighsImplications *)
                       ((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                       + 0x5dd0),iVar17,ppVar4[lVar16].first,&ppVar4[lVar16].second,dVar26,&local_a5
                       ,&local_a6,false);
          }
        }
        ppVar4 = (this->bestVlb).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar4[lVar16].first != -1) {
          dVar26 = ppVar4[lVar16].second.constant;
          dVar25 = ppVar4[lVar16].second.coef;
          dVar23 = 0.0;
          if (dVar25 <= 0.0) {
            dVar23 = dVar25;
          }
          dVar25 = dVar26 + dVar23;
          _Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          if ((dVar23 - (dVar25 - dVar26)) + (dVar26 - (dVar25 - (dVar25 - dVar26))) + 0.0 + dVar25
              < local_88 -
                *(double *)
                 ((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl +
                 0x6620)) {
            local_a7 = false;
            local_a8 = false;
            HighsImplications::cleanupVlb
                      ((HighsImplications *)
                       ((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                       + 0x5dd0),iVar17,ppVar4[lVar16].first,&ppVar4[lVar16].second,local_88,
                       &local_a7,&local_a8,false);
          }
        }
        local_70 = (vector<double,_std::allocator<double>_> *)
                   CONCAT71(local_70._1_7_,
                            (this->boundTypes).
                            super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16]);
        bVar8 = HighsLpRelaxation::isColIntegral(this->lprelaxation,iVar17);
        if (bVar8) {
          if ((double)local_90 <= 1.5) {
            pdVar12 = (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            pdVar12 = (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            dVar26 = (this->boundDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            if ((((dVar26 == 0.0) && (!NAN(dVar26))) &&
                ((pdVar12[lVar16] != 0.0 || (NAN(pdVar12[lVar16]))))) &&
               ((dVar26 = (this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar16], dVar26 != 0.0 ||
                (NAN(dVar26))))) {
              if ((this->bestVlb).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar16].first == -1) {
LAB_002efa7f:
                pBVar11 = (this->boundTypes).
                          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16;
              }
              else {
                dVar26 = (this->ubDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16];
                dVar25 = (this->lbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16];
                dVar23 = *(double *)
                          ((long)(pHVar2->mipdata_)._M_t.
                                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                 .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
                if (dVar26 < dVar25 - dVar23) goto LAB_002efa7f;
                if ((dVar25 < dVar26 - dVar23) ||
                   ((this->bestVub).
                    super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar16].first == -1))
                goto LAB_002ef94e;
                pBVar11 = (this->boundTypes).
                          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16;
                if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar20] <= 0.0) goto LAB_002ef958;
              }
              *pBVar11 = kVariableUb;
              ppVar4 = (this->bestVub).
                       super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar26 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar20];
              dVar25 = ppVar4[lVar16].second.constant * dVar26;
              local_88 = dVar22 - dVar25;
              local_b0 = local_b0 +
                         (dVar22 - (dVar25 + local_88)) +
                         (-dVar25 - (local_88 - (dVar25 + local_88)));
              HighsSparseVectorSum::add
                        (local_68,ppVar4[lVar16].first,dVar26 * ppVar4[lVar16].second.coef);
              pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              dVar26 = pdVar12[iVar20];
              dVar25 = -dVar26;
              pdVar12[iVar20] = dVar25;
              dVar22 = local_88;
              HVar19 = local_a4;
              if (dVar26 < dVar25) goto LAB_002ef9ea;
              goto LAB_002efc96;
            }
          }
          dVar26 = (this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          dVar25 = *(double *)
                    ((long)(pHVar2->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
          if (dVar26 - dVar25 <= pdVar12[lVar16]) {
            if (pdVar12[lVar16] - dVar25 <= dVar26) {
              pBVar11 = (this->boundTypes).
                        super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0.0 < (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[iVar20]) goto LAB_002ef88d;
            }
            else {
              pBVar11 = (this->boundTypes).
                        super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            pBVar11[lVar16] = kSimpleUb;
          }
          else {
            pBVar11 = (this->boundTypes).
                      super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_002ef88d:
            pBVar11[lVar16] = kSimpleLb;
          }
        }
        else {
          dVar26 = (this->lbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          dVar25 = (this->ubDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          dVar23 = *(double *)
                    ((long)(pHVar2->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
          if (dVar25 - dVar23 <= dVar26) {
            if (dVar25 < dVar26 - dVar23) {
              if (((this->bestVub).
                   super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16].first == -1) ||
                 (((!preferVbds &&
                   (pdVar1 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + iVar20,
                   0.0 < *pdVar1 || *pdVar1 == 0.0)) &&
                  ((this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16] <= dVar25 + dVar23)))) {
LAB_002efbd9:
                pBVar11 = (this->boundTypes).
                          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pBVar11[lVar16] = kSimpleUb;
                pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if (pdVar12[iVar20] < 0.0) {
                  dVar25 = local_48 * pdVar12[iVar20];
                  local_c0 = dVar22 - dVar25;
                  dVar26 = dVar25 + local_c0;
                  dVar25 = -dVar25 - (local_c0 - dVar26);
                  goto LAB_002efc32;
                }
                goto LAB_002efc96;
              }
              goto LAB_002efa7f;
            }
            HVar19 = local_a4;
            if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar20] <= 0.0) {
              if ((this->bestVub).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar16].first != -1) goto LAB_002efa7f;
              if ((!preferVbds) ||
                 ((this->bestVlb).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar16].first == -1)) goto LAB_002efbd9;
            }
            else if ((this->bestVlb).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].first == -1) {
              if ((!preferVbds) ||
                 ((this->bestVub).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar16].first == -1)) goto LAB_002efb60;
              goto LAB_002efa7f;
            }
LAB_002ef94e:
            pBVar11 = (this->boundTypes).
                      super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16;
LAB_002ef958:
            *pBVar11 = kVariableLb;
            ppVar4 = (this->bestVlb).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar26 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar20];
            dVar25 = ppVar4[lVar16].second.constant * dVar26;
            local_88 = dVar22 - dVar25;
            local_b0 = local_b0 +
                       (dVar22 - (dVar25 + local_88)) + (-dVar25 - (local_88 - (dVar25 + local_88)))
            ;
            HighsSparseVectorSum::add
                      (local_68,ppVar4[lVar16].first,dVar26 * ppVar4[lVar16].second.coef);
            pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar22 = local_88;
            HVar19 = local_a4;
            if (pdVar12[iVar20] <= 0.0) goto LAB_002efc96;
LAB_002ef9ea:
            (this->boundTypes).
            super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar16] = (BoundType)local_70;
            iVar17 = (int)local_98;
            uVar18 = (ulong)(iVar17 - 1);
            piVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar15[iVar20] = piVar15[(long)iVar17 + -1];
            pdVar12[iVar20] = pdVar12[(long)iVar17 + -1];
            piVar15[(long)iVar17 + -1] = 0;
            pdVar12[(long)iVar17 + -1] = 0.0;
            local_c0 = local_88;
            HVar19 = local_a4;
            goto LAB_002efc9e;
          }
          if (((this->bestVlb).
               super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].first != -1) &&
             (((preferVbds ||
               (0.0 < (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar20])) ||
              (dVar26 + dVar23 <
               (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16])))) goto LAB_002ef94e;
LAB_002efb60:
          pBVar11 = (this->boundTypes).
                    super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar11[lVar16] = kSimpleLb;
          pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if (0.0 < pdVar12[iVar20]) {
            dVar25 = local_88 * pdVar12[iVar20];
            local_c0 = dVar22 - dVar25;
            dVar26 = dVar25 + local_c0;
            dVar25 = -dVar25 - (local_c0 - dVar26);
LAB_002efc32:
            local_b0 = local_b0 + (dVar22 - dVar26) + dVar25;
            pBVar11[lVar16] = (BoundType)local_70;
            iVar17 = (int)local_98;
            uVar18 = (ulong)(iVar17 - 1);
            piVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar15[iVar20] = piVar15[(long)iVar17 + -1];
            pdVar12[iVar20] = pdVar12[(long)iVar17 + -1];
            piVar15[(long)iVar17 + -1] = 0;
            pdVar12[(long)iVar17 + -1] = 0.0;
            goto LAB_002efc9e;
          }
        }
LAB_002efc96:
        iVar20 = iVar20 + 1;
        uVar18 = local_98;
        local_c0 = dVar22;
      }
      else {
        if (dVar25 <= dVar26) {
          dVar26 = dVar25;
        }
        pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar26 = dVar26 * pdVar12[iVar20];
        local_c0 = dVar22 - dVar26;
        local_b0 = local_b0 +
                   (dVar22 - (dVar26 + local_c0)) + (-dVar26 - (local_c0 - (dVar26 + local_c0)));
        iVar17 = (int)local_98;
        piVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar15[iVar20] = piVar15[(long)iVar17 + -1];
        pdVar12[iVar20] = pdVar12[(long)iVar17 + -1];
        piVar15[(long)iVar17 + -1] = 0;
        pdVar12[(long)iVar17 + -1] = 0.0;
        uVar18 = (ulong)(iVar17 - 1);
      }
LAB_002efc9e:
      dVar22 = local_c0;
    } while (iVar20 < (int)uVar18);
  }
  piVar15 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar13 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar20 = (int)uVar18;
  if (piVar15 == piVar13) {
    std::vector<double,_std::allocator<double>_>::resize(vals,(long)iVar20);
    std::vector<int,_std::allocator<int>_>::resize(local_a0,(long)iVar20);
LAB_002efe6f:
    uVar21 = uVar18 & 0xffffffff;
    local_98 = uVar18;
    if ((int)uVar18 == 0) {
      std::vector<double,_std::allocator<double>_>::resize(local_58,uVar21);
      std::vector<double,_std::allocator<double>_>::resize(local_60,uVar21);
LAB_002f022e:
      local_c0 = local_c0 + local_b0;
      *local_50 = local_c0;
LAB_002f0246:
      if (-*(double *)
            ((long)(pHVar2->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620) <= local_c0)
      goto LAB_002f026b;
    }
    else {
      uVar18 = 0;
      do {
        iVar20 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
        lVar16 = (long)iVar20;
        if (iVar20 < HVar19) {
          _Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          local_88 = *(double *)
                      (*(long *)((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                       _M_head_impl + 0x698) + lVar16 * 8);
          local_90 = *(vector<double,_std::allocator<double>_> **)
                      (*(long *)((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                       _M_head_impl + 0x6b0) + lVar16 * 8);
        }
        else {
          local_88 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar20 - HVar19);
          local_90 = (vector<double,_std::allocator<double>_> *)
                     HighsLpRelaxation::slackUpper(this->lprelaxation,iVar20 - HVar19);
        }
        bVar8 = HighsLpRelaxation::isColIntegral(this->lprelaxation,iVar20);
        if ((bVar8) &&
           (pBVar11 = (this->boundTypes).
                      super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           (pBVar11[lVar16] & ~kSimpleLb) != kVariableUb)) {
          if (*integersPositive == true) {
            if (local_88 <= -INFINITY) {
              bVar8 = true;
              if ((double)local_90 < INFINITY) goto LAB_002eff8a;
            }
            else {
              bVar8 = true;
              if (((double)local_90 < INFINITY) &&
                 ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar18] <= 0.0)) {
LAB_002eff8a:
                bVar8 = false;
              }
            }
          }
          else {
            dVar22 = (this->ubDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            pdVar1 = (this->lbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar16;
            bVar8 = *pdVar1 <= dVar22 && dVar22 != *pdVar1;
          }
          pBVar11[lVar16] = bVar8;
        }
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
      iVar20 = (int)local_98;
      std::vector<double,_std::allocator<double>_>::resize(local_58,(long)iVar20);
      std::vector<double,_std::allocator<double>_>::resize(local_60,(long)iVar20);
      if (iVar20 == 0) goto LAB_002f022e;
      local_90 = &this->ubDist;
      local_70 = &this->lbDist;
      uVar18 = 0;
      do {
        iVar20 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
        lVar16 = (long)iVar20;
        if (iVar20 < HVar19) {
          _Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
               (pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>;
          dVar22 = *(double *)
                    (*(long *)((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                     _M_head_impl + 0x6b0) + lVar16 * 8);
          dVar26 = *(double *)
                    (*(long *)((long)_Var3.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                     _M_head_impl + 0x698) + lVar16 * 8);
        }
        else {
          local_88 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar20 - HVar19);
          uStack_80 = extraout_XMM0_Qb_01;
          dVar22 = HighsLpRelaxation::slackUpper(this->lprelaxation,iVar20 - HVar19);
          dVar26 = local_88;
        }
        (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar18] = dVar22 - dVar26;
        pvVar14 = local_70;
        switch((this->boundTypes).
               super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16]) {
        case kSimpleUb:
          pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar26 = pdVar12[uVar18];
          dVar22 = dVar22 * dVar26;
          dVar25 = local_c0 - dVar22;
          local_b0 = local_b0 +
                     (local_c0 - (dVar22 + dVar25)) + (-dVar22 - (dVar25 - (dVar22 + dVar25)));
          pdVar12[uVar18] = -dVar26;
          pvVar14 = local_90;
          local_c0 = dVar25;
          break;
        case kSimpleLb:
          dVar26 = dVar26 * (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar18];
          dVar22 = local_c0 - dVar26;
          local_b0 = local_b0 +
                     (local_c0 - (dVar26 + dVar22)) + (-dVar26 - (dVar22 - (dVar26 + dVar22)));
          local_c0 = dVar22;
          break;
        case kVariableUb:
          pvVar14 = local_90;
          break;
        case kVariableLb:
          break;
        default:
          goto switchD_002f0093_default;
        }
        (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar18] =
             (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar16];
switchD_002f0093_default:
        bVar8 = HighsLpRelaxation::isColIntegral(this->lprelaxation,iVar20);
        if (bVar8) {
          if (*integersPositive == true) {
            bVar8 = 0.0 < (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar18];
          }
          else {
            bVar8 = false;
          }
          *integersPositive = bVar8;
        }
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
      local_c0 = local_c0 + local_b0;
      *local_50 = local_c0;
      if ((int)local_98 == 0) goto LAB_002f0246;
    }
    bVar8 = true;
  }
  else {
    this_01 = &this->vectorsum;
    if (iVar20 != 0) {
      uVar21 = 0;
      do {
        dVar22 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar21];
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          HighsSparseVectorSum::add
                    (this_01,(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar21],dVar22);
        }
        uVar21 = uVar21 + 1;
      } while ((uVar18 & 0xffffffff) != uVar21);
      piVar15 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar13 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    this_00 = &(this->vectorsum).nonzeroinds;
    uVar18 = (ulong)((long)piVar13 - (long)piVar15) >> 2;
    uVar9 = (uint)uVar18;
    if (0 < (int)uVar9) {
      pHVar5 = (this_01->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar6 = pHVar2->options_mip_;
      uVar21 = (ulong)(uVar9 & 0x7fffffff) + 1;
      do {
        iVar20 = piVar15[uVar21 - 2];
        if (ABS(pHVar5[iVar20].hi + pHVar5[iVar20].lo) <=
            (pHVar6->super_HighsOptionsStruct).small_matrix_value) {
          iVar10 = (int)uVar18;
          uVar18 = (ulong)(iVar10 - 1);
          pHVar5[iVar20].hi = 0.0;
          pHVar5[iVar20].lo = 0.0;
          iVar17 = piVar15[(long)iVar10 + -1];
          piVar15[(long)iVar10 + -1] = iVar20;
          piVar15[uVar21 - 2] = iVar17;
        }
        uVar9 = (uint)uVar18;
        uVar21 = uVar21 - 1;
      } while (1 < uVar21);
    }
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)uVar9);
    pvVar7 = local_a0;
    pdVar1 = (double *)
             ((long)(pHVar2->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6620);
    if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
      std::vector<int,_std::allocator<int>_>::operator=(local_a0,this_00);
      uVar18 = (ulong)((long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      std::vector<double,_std::allocator<double>_>::resize(vals,(long)(int)uVar18);
      if ((int)uVar18 != 0) {
        piVar15 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar5 = (this_01->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar12 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar21 = 0;
        do {
          iVar20 = piVar15[uVar21];
          pdVar12[uVar21] = pHVar5[iVar20].hi + pHVar5[iVar20].lo;
          uVar21 = uVar21 + 1;
        } while ((uVar18 & 0xffffffff) != uVar21);
      }
      HighsSparseVectorSum::clear(this_01);
      goto LAB_002efe6f;
    }
LAB_002f020a:
    HighsSparseVectorSum::clear(this_01);
LAB_002f026b:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool HighsTransformedLp::transform(std::vector<double>& vals,
                                   std::vector<double>& upper,
                                   std::vector<double>& solval,
                                   std::vector<HighsInt>& inds, double& rhs,
                                   bool& integersPositive, bool preferVbds) {
  // vector sum should be empty
  assert(vectorsum.getNonzeros().empty());

  HighsCDouble tmpRhs = rhs;

  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = lprelaxation.numCols();

  HighsInt numNz = inds.size();

  auto getLb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_lower_[col]
                              : lprelaxation.slackLower(col - slackOffset));
  };

  auto getUb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_upper_[col]
                              : lprelaxation.slackUpper(col - slackOffset));
  };

  auto remove = [&](HighsInt position) {
    numNz--;
    inds[position] = inds[numNz];
    vals[position] = vals[numNz];
    inds[numNz] = 0;
    vals[numNz] = 0;
  };

  HighsInt i = 0;
  while (i < numNz) {
    HighsInt col = inds[i];

    double lb = getLb(col);
    double ub = getUb(col);

    if (ub - lb < mip.options_mip_->small_matrix_value) {
      tmpRhs -= std::min(lb, ub) * vals[i];
      remove(i);
      continue;
    }

    if (lb == -kHighsInf && ub == kHighsInf) {
      vectorsum.clear();
      return false;
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable upper bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable upper
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable upper bound.
    if (bestVub[col].first != -1 &&
        bestVub[col].second.maxValue() > ub + mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVub(col, bestVub[col].first,
                                            bestVub[col].second, ub, redundant,
                                            infeasible, false);
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable lower bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable lower
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable lower bound.
    if (bestVlb[col].first != -1 &&
        bestVlb[col].second.minValue() < lb - mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVlb(col, bestVlb[col].first,
                                            bestVlb[col].second, lb, redundant,
                                            infeasible, false);
    }

    // store the old bound type so that we can restore it if the continuous
    // column is relaxed out anyways. This allows to correctly transform and
    // then untransform multiple base rows which is useful to compute cuts based
    // on several transformed base rows. It could otherwise lead to bugs if a
    // column is first transformed with a simple bound and not relaxed but for
    // another base row is transformed and relaxed with a variable bound. Should
    // the non-relaxed column now be untransformed we would wrongly use the
    // variable bound even though this is not the correct way to untransform the
    // column.
    BoundType oldBoundType = boundTypes[col];

    if (lprelaxation.isColIntegral(col)) {
      if (ub - lb <= 1.5 || boundDist[col] != 0.0 || simpleLbDist[col] == 0 ||
          simpleUbDist[col] == 0) {
        // since we skip the handling of variable bound constraints for all
        // binary and some general-integer variables here, the bound type used
        // should be a simple lower or upper bound
        if (simpleLbDist[col] < simpleUbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else if (simpleUbDist[col] <
                   simpleLbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleUb;
        } else if (vals[i] > 0) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else {
          boundTypes[col] = BoundType::kSimpleUb;
        }
        i++;
        continue;
      }
      if (bestVlb[col].first == -1 ||
          ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else if (bestVub[col].first == -1 ||
                 lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      } else if (vals[i] > 0) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      }
    } else {
      if (lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        if (bestVlb[col].first == -1)
          boundTypes[col] = BoundType::kSimpleLb;
        else if (preferVbds || vals[i] > 0 ||
                 simpleLbDist[col] > lbDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else if (ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        if (bestVub[col].first == -1)
          boundTypes[col] = BoundType::kSimpleUb;
        else if (preferVbds || vals[i] < 0 ||
                 simpleUbDist[col] > ubDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      } else if (vals[i] > 0) {
        if (bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else if (preferVbds && bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else {
        if (bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else if (preferVbds && bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      }
    }

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb:
        if (vals[i] > 0) {
          // relax away using lower bound
          tmpRhs -= lb * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kSimpleUb:
        if (vals[i] < 0) {
          // relax away using upper bound
          tmpRhs -= ub * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableLb:
        tmpRhs -= bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, vals[i] * bestVlb[col].second.coef);
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableUb:
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vals[i] = -vals[i];
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
    }
    // move to next element
    i++;
  }

  if (!vectorsum.getNonzeros().empty()) {
    for (HighsInt i = 0; i != numNz; ++i) {
      if (vals[i] != 0.0) vectorsum.add(inds[i], vals[i]);
    }

    double maxError = 0.0;
    auto IsZero = [&](HighsInt col, double val) {
      if (std::abs(val) <= mip.options_mip_->small_matrix_value) return true;
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (maxError > mip.mipdata_->feastol) {
      vectorsum.clear();
      return false;
    }

    inds = vectorsum.getNonzeros();
    numNz = inds.size();

    vals.resize(numNz);
    for (HighsInt j = 0; j != numNz; ++j) vals[j] = vectorsum.getValue(inds[j]);

    vectorsum.clear();
  } else {
    vals.resize(numNz);
    inds.resize(numNz);
  }

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    // get bounds
    double lb = getLb(col);
    double ub = getUb(col);

    // variable should not be free
    assert(lb != -kHighsInf || ub != kHighsInf);

    // set bound type for previously unprocessed integer-constrained variables
    if (!lprelaxation.isColIntegral(col)) continue;

    // do not overwrite bound type for integral slacks from vlb / vub
    // constraints
    if (boundTypes[col] == BoundType::kVariableLb ||
        boundTypes[col] == BoundType::kVariableUb)
      continue;

    // complement integers to make coefficients positive if both bounds are
    // finite; otherwise, complement integers with closest bound.
    // take into account 'integersPositive' provided by caller.
    if (integersPositive) {
      if ((lb != -kHighsInf && vals[j] > 0) || ub == kHighsInf)
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    } else {
      if (lbDist[col] < ubDist[col])
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    }
  }

  upper.resize(numNz);
  solval.resize(numNz);

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    double lb = getLb(col);
    double ub = getUb(col);

    upper[j] = ub - lb;

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb: {
        // shift (lower bound)
        assert(lb != -kHighsInf);
        tmpRhs -= lb * vals[j];
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kSimpleUb: {
        // complement (upper bound)
        assert(ub != kHighsInf);
        tmpRhs -= ub * vals[j];
        vals[j] = -vals[j];
        solval[j] = ubDist[col];
        break;
      }
      case BoundType::kVariableLb: {
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kVariableUb: {
        solval[j] = ubDist[col];
        break;
      }
    }

    // check if all integer-constrained variables have positive coefficients
    if (lprelaxation.isColIntegral(col))
      integersPositive = integersPositive && vals[j] > 0;
  }

  rhs = double(tmpRhs);

  if (numNz == 0 && rhs >= -mip.mipdata_->feastol) return false;

  return true;
}